

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callFunctionTestSuite.cpp
# Opt level: O2

bool callMultipleGetSum(void)

{
  int iVar1;
  int args;
  bool bVar2;
  allocator<char> local_81;
  string local_80;
  Test t;
  
  Test::Test(&t);
  bVar2 = false;
  for (args = 0; args != 10; args = args + 1) {
    iVar1 = accessor::callFunction<accessor::FunctionWrapper<Test,int,int,int>,Test,int,int>
                      (&t,args,10);
    if (args + 10 == iVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"getSum",&local_81);
      iVar1 = Test::getMethodVisitedCounter(&t,&local_80);
      bVar2 = args < iVar1;
      std::__cxx11::string::~string((string *)&local_80);
    }
    else {
      bVar2 = false;
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)&t);
  return bVar2;
}

Assistant:

bool callMultipleGetSum()
{
  Test t;
  int callsNumber = 10;
  bool testResult = false;

  for (int i = 0; i < callsNumber; ++i)
  {
    int expectedSum = i + callsNumber;
    testResult = (::accessor::callFunction<TestGetSum>(t, i, callsNumber) == expectedSum) &&
                 (t.getMethodVisitedCounter("getSum") > i);
  }

  return testResult;
}